

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::ClassNamePrefix<google::protobuf::ServiceDescriptor>
                   (string *classname,ServiceDescriptor *desc)

{
  FileDescriptor *this;
  string *psVar1;
  ulong uVar2;
  ServiceDescriptor *in_RDX;
  string *in_RDI;
  string *prefix;
  FileDescriptor *in_stack_00000080;
  string *in_stack_00000088;
  
  this = ServiceDescriptor::file(in_RDX);
  FileDescriptor::options(this);
  psVar1 = FileOptions::php_class_prefix_abi_cxx11_((FileOptions *)0x4abc2a);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  }
  else {
    ServiceDescriptor::file(in_RDX);
    ReservedNamePrefix(in_stack_00000088,in_stack_00000080);
  }
  return in_RDI;
}

Assistant:

std::string ClassNamePrefix(const string& classname,
                            const DescriptorType* desc) {
  const string& prefix = (desc->file()->options()).php_class_prefix();
  if (!prefix.empty()) {
    return prefix;
  }

  return ReservedNamePrefix(classname, desc->file());
}